

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCrossCut(Gia_Man_t *p,int fReverse)

{
  uint *puVar1;
  ulong uVar2;
  int v;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int i;
  
  p_00 = Gia_ManDfsForCrossCut(p,fReverse);
  iVar6 = 0;
  iVar5 = 0;
  for (i = 0; i < p_00->nSize; i = i + 1) {
    v = Vec_IntEntry(p_00,i);
    pGVar3 = Gia_ManObj(p,v);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar6 = (iVar6 + 1) - (uint)(pGVar3->Value == 0);
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    uVar2 = *(ulong *)pGVar3;
    uVar4 = uVar2 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || (int)uVar2 < 0) {
      if ((int)uVar2 < 0 && (int)uVar4 != 0x1fffffff) goto LAB_006198b5;
    }
    else {
      puVar1 = &pGVar3[-uVar4].Value;
      *puVar1 = *puVar1 - 1;
      iVar6 = iVar6 - (uint)(*puVar1 == 0);
      uVar4 = (ulong)((uint)(uVar2 >> 0x20) & 0x1fffffff);
LAB_006198b5:
      puVar1 = &pGVar3[-uVar4].Value;
      *puVar1 = *puVar1 - 1;
      iVar6 = iVar6 - (uint)(*puVar1 == 0);
    }
  }
  Vec_IntFree(p_00);
  iVar6 = 0;
  while( true ) {
    if (p->nObjs <= iVar6) {
      return iVar5;
    }
    pGVar3 = Gia_ManObj(p,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar6 = iVar6 + 1;
    if (pGVar3->Value != 0) {
      __assert_fail("pObj->Value == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x34f,"int Gia_ManCrossCut(Gia_Man_t *, int)");
    }
  }
  return iVar5;
}

Assistant:

int Gia_ManCrossCut( Gia_Man_t * p, int fReverse )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    vNodes = Gia_ManDfsForCrossCut( p, fReverse );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
    Vec_IntFree( vNodes );
    Gia_ManForEachObj( p, pObj, i )
        assert( pObj->Value == 0 );
    return nCutMax;
}